

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O0

_Bool duckdb_je_pa_shard_enable_hpa
                (tsdn_t *tsdn,pa_shard_t *shard,hpa_shard_opts_t *hpa_opts,sec_opts_t *hpa_sec_opts)

{
  _Bool _Var1;
  hpa_shard_t *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  sec_opts_t *unaff_retaddr;
  pai_t *in_stack_00000008;
  base_t *in_stack_00000010;
  sec_t *in_stack_00000018;
  tsdn_t *in_stack_00000020;
  edata_cache_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  emap_t *in_stack_ffffffffffffffb0;
  hpa_central_t *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  _Var1 = duckdb_je_hpa_shard_init
                    (in_RCX,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (base_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,(uint)((ulong)in_RDX >> 0x20),
                     (hpa_shard_opts_t *)
                     CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (_Var1) {
    _Var1 = true;
  }
  else {
    _Var1 = duckdb_je_sec_init(in_stack_00000020,in_stack_00000018,in_stack_00000010,
                               in_stack_00000008,unaff_retaddr);
    if (_Var1) {
      _Var1 = true;
    }
    else {
      *(undefined1 *)(in_RSI + 0x11) = 1;
      *(undefined1 *)(in_RSI + 0x10) = 1;
      _Var1 = false;
    }
  }
  return _Var1;
}

Assistant:

bool
pa_shard_enable_hpa(tsdn_t *tsdn, pa_shard_t *shard,
    const hpa_shard_opts_t *hpa_opts, const sec_opts_t *hpa_sec_opts) {
	if (hpa_shard_init(&shard->hpa_shard, &shard->central->hpa, shard->emap,
	    shard->base, &shard->edata_cache, shard->ind, hpa_opts)) {
		return true;
	}
	if (sec_init(tsdn, &shard->hpa_sec, shard->base, &shard->hpa_shard.pai,
	    hpa_sec_opts)) {
		return true;
	}
	shard->ever_used_hpa = true;
	atomic_store_b(&shard->use_hpa, true, ATOMIC_RELAXED);

	return false;
}